

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::find_static_extensions(CompilerGLSL *this)

{
  Capability CVar1;
  bool bVar2;
  ExecutionModel EVar3;
  CompilerError *pCVar4;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__end1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__begin1_1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *__range1_1;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [39];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [32];
  Capability *local_2c0;
  Capability *cap_1;
  Capability *__end1;
  Capability *__begin1;
  SmallVector<spv::Capability,_8UL> *__range1;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  reference local_200;
  pair<unsigned_int,_bool> *att;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_> *__range2_1
  ;
  string local_1d8 [5];
  bool has_incoherent;
  bool has_coherent;
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  Capability *local_140;
  Capability *cap;
  Capability *__end2;
  Capability *__begin2;
  SmallVector<spv::Capability,_8UL> *__range2;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  SPIREntryPoint *local_20;
  SPIREntryPoint *execution;
  CompilerGLSL *local_10;
  CompilerGLSL *this_local;
  
  execution = (SPIREntryPoint *)this;
  local_10 = this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRType,spirv_cross::CompilerGLSL::find_static_extensions()::__0>
            (&(this->super_Compiler).ir,(anon_class_8_1_8991fb9c *)&execution);
  local_20 = Compiler::get_entry_point(&this->super_Compiler);
  EVar3 = local_20->model;
  if (EVar3 - ExecutionModelTessellationControl < 2) {
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x140)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f0,"GL_EXT_tessellation_shader",&local_f1);
      require_extension_internal(this,(string *)local_f0);
      ::std::__cxx11::string::~string(local_f0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    }
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 400)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_118,"GL_ARB_tessellation_shader",(allocator *)((long)&__range2 + 7));
      require_extension_internal(this,(string *)local_118);
      ::std::__cxx11::string::~string(local_118);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    }
  }
  else if (EVar3 == ExecutionModelGeometry) {
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x140)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_78,"GL_EXT_geometry_shader",&local_79);
      require_extension_internal(this,(string *)local_78);
      ::std::__cxx11::string::~string(local_78);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x96)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a0,"GL_ARB_geometry_shader4",&local_a1);
      require_extension_internal(this,(string *)local_a0);
      ::std::__cxx11::string::~string(local_a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
    bVar2 = Bitset::get(&local_20->flags,0);
    if ((((bVar2) && (local_20->invocations != 1)) && (((this->options).es & 1U) == 0)) &&
       ((this->options).version < 400)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c8,"GL_ARB_gpu_shader5",&local_c9);
      require_extension_internal(this,(string *)local_c8);
      ::std::__cxx11::string::~string(local_c8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    }
  }
  else if (EVar3 == ExecutionModelGLCompute) {
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1ae)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_40,"GL_ARB_compute_shader",&local_41);
      require_extension_internal(this,(string *)local_40);
      ::std::__cxx11::string::~string(local_40);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x136)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"At least ESSL 3.10 required for compute shaders.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
  }
  else if (EVar3 - ExecutionModelRayGenerationKHR < 6) {
    if ((((this->options).es & 1U) != 0) || ((this->options).version < 0x1cc)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar4,"Ray tracing shaders require non-es profile with version 460 or above.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((this->options).vulkan_semantics & 1U) == 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Ray tracing requires Vulkan semantics.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    __begin2 = (Capability *)&(this->super_Compiler).ir.declared_capabilities;
    __end2 = VectorView<spv::Capability>::begin((VectorView<spv::Capability> *)__begin2);
    cap = VectorView<spv::Capability>::end((VectorView<spv::Capability> *)__begin2);
    for (; __end2 != cap; __end2 = __end2 + 1) {
      local_140 = __end2;
      if (((*__end2 == CapabilityRayTracingKHR) || (*__end2 == CapabilityRayQueryKHR)) ||
         (*__end2 == CapabilityRayTraversalPrimitiveCullingKHR)) {
        this->ray_tracing_is_khr = true;
        break;
      }
    }
    if ((this->ray_tracing_is_khr & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_188,"GL_NV_ray_tracing",&local_189);
      require_extension_internal(this,(string *)local_188);
      ::std::__cxx11::string::~string(local_188);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_189);
    }
    else {
      ray_tracing_khr_fixup_locations(this);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_160,"GL_EXT_ray_tracing",&local_161);
      require_extension_internal(this,(string *)local_160);
      ::std::__cxx11::string::~string(local_160);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_161);
    }
  }
  else if (EVar3 - ExecutionModelTaskEXT < 2) {
    if ((((this->options).es & 1U) != 0) || ((this->options).version < 0x1c2)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Mesh shaders require GLSL 450 or above.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((this->options).vulkan_semantics & 1U) == 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Mesh shaders require Vulkan semantics.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1b0,"GL_EXT_mesh_shader",&local_1b1);
    require_extension_internal(this,(string *)local_1b0);
    ::std::__cxx11::string::~string(local_1b0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  }
  bVar2 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::empty
                    (&this->pls_inputs);
  if ((!bVar2) ||
     (bVar2 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::empty
                        (&this->pls_outputs), !bVar2)) {
    if (local_20->model != ExecutionModelFragment) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar4,"Can only use GL_EXT_shader_pixel_local_storage in fragment shaders.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_1d8,"GL_EXT_shader_pixel_local_storage",(allocator *)((long)&__range2_1 + 7));
    require_extension_internal(this,(string *)local_1d8);
    ::std::__cxx11::string::~string(local_1d8);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
  }
  bVar2 = ::std::
          vector<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>::
          empty(&this->inout_color_attachments);
  if (!bVar2) {
    if (local_20->model != ExecutionModelFragment) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar4,"Can only use GL_EXT_shader_framebuffer_fetch in fragment shaders.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((this->options).vulkan_semantics & 1U) != 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Cannot use EXT_shader_framebuffer_fetch in Vulkan GLSL.")
      ;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    __range2_1._6_1_ = 0;
    __range2_1._5_1_ = 0;
    __end2_1 = ::std::
               vector<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>
               ::begin(&this->inout_color_attachments);
    att = (pair<unsigned_int,_bool> *)
          ::std::
          vector<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>::
          end(&this->inout_color_attachments);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::pair<unsigned_int,_bool>_*,_std::vector<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>_>
                               *)&att), bVar2) {
      local_200 = __gnu_cxx::
                  __normal_iterator<std::pair<unsigned_int,_bool>_*,_std::vector<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>_>
                  ::operator*(&__end2_1);
      if ((local_200->second & 1U) == 0) {
        __range2_1._5_1_ = 1;
      }
      else {
        __range2_1._6_1_ = 1;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_int,_bool>_*,_std::vector<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>_>
      ::operator++(&__end2_1);
    }
    if ((__range2_1._6_1_ & 1) != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_220,"GL_EXT_shader_framebuffer_fetch",&local_221);
      require_extension_internal(this,(string *)local_220);
      ::std::__cxx11::string::~string(local_220);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_221);
    }
    if ((__range2_1._5_1_ & 1) != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_248,"GL_EXT_shader_framebuffer_fetch_non_coherent",&local_249);
      require_extension_internal(this,(string *)local_248);
      ::std::__cxx11::string::~string(local_248);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_249);
    }
  }
  if (((((this->options).separate_shader_objects & 1U) != 0) && (((this->options).es & 1U) == 0)) &&
     ((this->options).version < 0x19a)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_270,"GL_ARB_separate_shader_objects",&local_271);
    require_extension_internal(this,(string *)local_270);
    ::std::__cxx11::string::~string(local_270);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_271);
  }
  if ((this->super_Compiler).ir.addressing_model == AddressingModelPhysicalStorageBuffer64) {
    if (((this->options).vulkan_semantics & 1U) == 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar4,"GL_EXT_buffer_reference is only supported in Vulkan GLSL.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x140)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"GL_EXT_buffer_reference requires ESSL 320.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1c2)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"GL_EXT_buffer_reference requires GLSL 450.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_298,"GL_EXT_buffer_reference2",(allocator *)((long)&__range1 + 7));
    require_extension_internal(this,(string *)local_298);
    ::std::__cxx11::string::~string(local_298);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  }
  else if ((this->super_Compiler).ir.addressing_model != AddressingModelLogical) {
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (pCVar4,"Only Logical and PhysicalStorageBuffer64EXT addressing models are supported."
              );
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  __begin1 = (Capability *)&(this->super_Compiler).ir.declared_capabilities;
  __end1 = VectorView<spv::Capability>::begin((VectorView<spv::Capability> *)__begin1);
  cap_1 = VectorView<spv::Capability>::end((VectorView<spv::Capability> *)__begin1);
  do {
    if (__end1 == cap_1) {
      if ((this->options).ovr_multiview_view_count != 0) {
        if (((this->options).vulkan_semantics & 1U) != 0) {
          pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar4,"OVR_multiview2 cannot be used with Vulkan semantics.");
          __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        EVar3 = Compiler::get_execution_model(&this->super_Compiler);
        if (EVar3 != ExecutionModelVertex) {
          pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar4,"OVR_multiview2 can only be used with Vertex shaders.");
          __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_420,"GL_OVR_multiview2",(allocator *)((long)&__range1_1 + 7));
        require_extension_internal(this,(string *)local_420);
        ::std::__cxx11::string::~string(local_420);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
      }
      this_00 = &(this->super_Compiler).ir.declared_extensions;
      __end1_1 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::begin(&this_00->
                          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        );
      pbVar5 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::end(&this_00->
                      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    );
      for (; __end1_1 != pbVar5; __end1_1 = __end1_1 + 0x20) {
        bVar2 = ::std::operator==(__end1_1,"SPV_NV_fragment_shader_barycentric");
        if (bVar2) {
          this->barycentric_is_nv = true;
        }
      }
      return;
    }
    local_2c0 = __end1;
    CVar1 = *__end1;
    if (CVar1 == CapabilityMultiView) {
      if (((this->options).vulkan_semantics & 1U) == 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_3a8,"GL_OVR_multiview2",&local_3a9);
        require_extension_internal(this,(string *)local_3a8);
        ::std::__cxx11::string::~string(local_3a8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
        if ((this->options).ovr_multiview_view_count == 0) {
          pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar4,
                     "ovr_multiview_view_count must be non-zero when using GL_OVR_multiview2.");
          __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        EVar3 = Compiler::get_execution_model(&this->super_Compiler);
        if (EVar3 != ExecutionModelVertex) {
          pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar4,"OVR_multiview2 can only be used with Vertex shaders.");
          __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_380,"GL_EXT_multiview",&local_381);
        require_extension_internal(this,(string *)local_380);
        ::std::__cxx11::string::~string(local_380);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_381);
      }
    }
    else {
      if (CVar1 - CapabilityVariablePointersStorageBuffer < 2) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"VariablePointers capability is not supported in GLSL.")
        ;
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (CVar1 == CapabilityRayQueryKHR) {
        if (((((this->options).es & 1U) != 0) || ((this->options).version < 0x1cc)) ||
           (((this->options).vulkan_semantics & 1U) == 0)) {
          pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar4,"RayQuery requires Vulkan GLSL 460.");
          __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_3d0,"GL_EXT_ray_query",&local_3d1);
        require_extension_internal(this,(string *)local_3d0);
        ::std::__cxx11::string::~string(local_3d0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
        this->ray_tracing_is_khr = true;
      }
      else if (CVar1 == CapabilityRayTraversalPrimitiveCullingKHR) {
        if (((((this->options).es & 1U) != 0) || ((this->options).version < 0x1cc)) ||
           (((this->options).vulkan_semantics & 1U) == 0)) {
          pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar4,"RayQuery requires Vulkan GLSL 460.");
          __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_3f8,"GL_EXT_ray_flags_primitive_culling",&local_3f9);
        require_extension_internal(this,(string *)local_3f8);
        ::std::__cxx11::string::~string(local_3f8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
        this->ray_tracing_is_khr = true;
      }
      else if (CVar1 == CapabilityGeometryShaderPassthroughNV) {
        if (local_20->model == ExecutionModelGeometry) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_358,"GL_NV_geometry_shader_passthrough",&local_359);
          require_extension_internal(this,(string *)local_358);
          ::std::__cxx11::string::~string(local_358);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_359);
          local_20->geometry_passthrough = true;
        }
      }
      else if (CVar1 == CapabilityShaderNonUniform) {
        if (((this->options).vulkan_semantics & 1U) == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_2e0,"GL_NV_gpu_shader5",&local_2e1);
          require_extension_internal(this,(string *)local_2e0);
          ::std::__cxx11::string::~string(local_2e0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_308,"GL_EXT_nonuniform_qualifier",&local_309);
          require_extension_internal(this,(string *)local_308);
          ::std::__cxx11::string::~string(local_308);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_309);
        }
      }
      else if (CVar1 == CapabilityRuntimeDescriptorArray) {
        if (((this->options).vulkan_semantics & 1U) == 0) {
          pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar4,"GL_EXT_nonuniform_qualifier is only supported in Vulkan GLSL.");
          __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_330,"GL_EXT_nonuniform_qualifier",&local_331);
        require_extension_internal(this,(string *)local_330);
        ::std::__cxx11::string::~string(local_330);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_331);
      }
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

void CompilerGLSL::find_static_extensions()
{
	ir.for_each_typed_id<SPIRType>([&](uint32_t, const SPIRType &type) {
		if (type.basetype == SPIRType::Double)
		{
			if (options.es)
				SPIRV_CROSS_THROW("FP64 not supported in ES profile.");
			if (!options.es && options.version < 400)
				require_extension_internal("GL_ARB_gpu_shader_fp64");
		}
		else if (type.basetype == SPIRType::Int64 || type.basetype == SPIRType::UInt64)
		{
			if (options.es && options.version < 310) // GL_NV_gpu_shader5 fallback requires 310.
				SPIRV_CROSS_THROW("64-bit integers not supported in ES profile before version 310.");
			require_extension_internal("GL_ARB_gpu_shader_int64");
		}
		else if (type.basetype == SPIRType::Half)
		{
			require_extension_internal("GL_EXT_shader_explicit_arithmetic_types_float16");
			if (options.vulkan_semantics)
				require_extension_internal("GL_EXT_shader_16bit_storage");
		}
		else if (type.basetype == SPIRType::SByte || type.basetype == SPIRType::UByte)
		{
			require_extension_internal("GL_EXT_shader_explicit_arithmetic_types_int8");
			if (options.vulkan_semantics)
				require_extension_internal("GL_EXT_shader_8bit_storage");
		}
		else if (type.basetype == SPIRType::Short || type.basetype == SPIRType::UShort)
		{
			require_extension_internal("GL_EXT_shader_explicit_arithmetic_types_int16");
			if (options.vulkan_semantics)
				require_extension_internal("GL_EXT_shader_16bit_storage");
		}
	});

	auto &execution = get_entry_point();
	switch (execution.model)
	{
	case ExecutionModelGLCompute:
		if (!options.es && options.version < 430)
			require_extension_internal("GL_ARB_compute_shader");
		if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("At least ESSL 3.10 required for compute shaders.");
		break;

	case ExecutionModelGeometry:
		if (options.es && options.version < 320)
			require_extension_internal("GL_EXT_geometry_shader");
		if (!options.es && options.version < 150)
			require_extension_internal("GL_ARB_geometry_shader4");

		if (execution.flags.get(ExecutionModeInvocations) && execution.invocations != 1)
		{
			// Instanced GS is part of 400 core or this extension.
			if (!options.es && options.version < 400)
				require_extension_internal("GL_ARB_gpu_shader5");
		}
		break;

	case ExecutionModelTessellationEvaluation:
	case ExecutionModelTessellationControl:
		if (options.es && options.version < 320)
			require_extension_internal("GL_EXT_tessellation_shader");
		if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_tessellation_shader");
		break;

	case ExecutionModelRayGenerationKHR:
	case ExecutionModelIntersectionKHR:
	case ExecutionModelAnyHitKHR:
	case ExecutionModelClosestHitKHR:
	case ExecutionModelMissKHR:
	case ExecutionModelCallableKHR:
		// NV enums are aliases.
		if (options.es || options.version < 460)
			SPIRV_CROSS_THROW("Ray tracing shaders require non-es profile with version 460 or above.");
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Ray tracing requires Vulkan semantics.");

		// Need to figure out if we should target KHR or NV extension based on capabilities.
		for (auto &cap : ir.declared_capabilities)
		{
			if (cap == CapabilityRayTracingKHR || cap == CapabilityRayQueryKHR ||
			    cap == CapabilityRayTraversalPrimitiveCullingKHR)
			{
				ray_tracing_is_khr = true;
				break;
			}
		}

		if (ray_tracing_is_khr)
		{
			// In KHR ray tracing we pass payloads by pointer instead of location,
			// so make sure we assign locations properly.
			ray_tracing_khr_fixup_locations();
			require_extension_internal("GL_EXT_ray_tracing");
		}
		else
			require_extension_internal("GL_NV_ray_tracing");
		break;

	case ExecutionModelMeshEXT:
	case ExecutionModelTaskEXT:
		if (options.es || options.version < 450)
			SPIRV_CROSS_THROW("Mesh shaders require GLSL 450 or above.");
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Mesh shaders require Vulkan semantics.");
		require_extension_internal("GL_EXT_mesh_shader");
		break;

	default:
		break;
	}

	if (!pls_inputs.empty() || !pls_outputs.empty())
	{
		if (execution.model != ExecutionModelFragment)
			SPIRV_CROSS_THROW("Can only use GL_EXT_shader_pixel_local_storage in fragment shaders.");
		require_extension_internal("GL_EXT_shader_pixel_local_storage");
	}

	if (!inout_color_attachments.empty())
	{
		if (execution.model != ExecutionModelFragment)
			SPIRV_CROSS_THROW("Can only use GL_EXT_shader_framebuffer_fetch in fragment shaders.");
		if (options.vulkan_semantics)
			SPIRV_CROSS_THROW("Cannot use EXT_shader_framebuffer_fetch in Vulkan GLSL.");

		bool has_coherent = false;
		bool has_incoherent = false;

		for (auto &att : inout_color_attachments)
		{
			if (att.second)
				has_coherent = true;
			else
				has_incoherent = true;
		}

		if (has_coherent)
			require_extension_internal("GL_EXT_shader_framebuffer_fetch");
		if (has_incoherent)
			require_extension_internal("GL_EXT_shader_framebuffer_fetch_non_coherent");
	}

	if (options.separate_shader_objects && !options.es && options.version < 410)
		require_extension_internal("GL_ARB_separate_shader_objects");

	if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("GL_EXT_buffer_reference is only supported in Vulkan GLSL.");
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("GL_EXT_buffer_reference requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("GL_EXT_buffer_reference requires GLSL 450.");
		require_extension_internal("GL_EXT_buffer_reference2");
	}
	else if (ir.addressing_model != AddressingModelLogical)
	{
		SPIRV_CROSS_THROW("Only Logical and PhysicalStorageBuffer64EXT addressing models are supported.");
	}

	// Check for nonuniform qualifier and passthrough.
	// Instead of looping over all decorations to find this, just look at capabilities.
	for (auto &cap : ir.declared_capabilities)
	{
		switch (cap)
		{
		case CapabilityShaderNonUniformEXT:
			if (!options.vulkan_semantics)
				require_extension_internal("GL_NV_gpu_shader5");
			else
				require_extension_internal("GL_EXT_nonuniform_qualifier");
			break;
		case CapabilityRuntimeDescriptorArrayEXT:
			if (!options.vulkan_semantics)
				SPIRV_CROSS_THROW("GL_EXT_nonuniform_qualifier is only supported in Vulkan GLSL.");
			require_extension_internal("GL_EXT_nonuniform_qualifier");
			break;

		case CapabilityGeometryShaderPassthroughNV:
			if (execution.model == ExecutionModelGeometry)
			{
				require_extension_internal("GL_NV_geometry_shader_passthrough");
				execution.geometry_passthrough = true;
			}
			break;

		case CapabilityVariablePointers:
		case CapabilityVariablePointersStorageBuffer:
			SPIRV_CROSS_THROW("VariablePointers capability is not supported in GLSL.");

		case CapabilityMultiView:
			if (options.vulkan_semantics)
				require_extension_internal("GL_EXT_multiview");
			else
			{
				require_extension_internal("GL_OVR_multiview2");
				if (options.ovr_multiview_view_count == 0)
					SPIRV_CROSS_THROW("ovr_multiview_view_count must be non-zero when using GL_OVR_multiview2.");
				if (get_execution_model() != ExecutionModelVertex)
					SPIRV_CROSS_THROW("OVR_multiview2 can only be used with Vertex shaders.");
			}
			break;

		case CapabilityRayQueryKHR:
			if (options.es || options.version < 460 || !options.vulkan_semantics)
				SPIRV_CROSS_THROW("RayQuery requires Vulkan GLSL 460.");
			require_extension_internal("GL_EXT_ray_query");
			ray_tracing_is_khr = true;
			break;

		case CapabilityRayTraversalPrimitiveCullingKHR:
			if (options.es || options.version < 460 || !options.vulkan_semantics)
				SPIRV_CROSS_THROW("RayQuery requires Vulkan GLSL 460.");
			require_extension_internal("GL_EXT_ray_flags_primitive_culling");
			ray_tracing_is_khr = true;
			break;

		default:
			break;
		}
	}

	if (options.ovr_multiview_view_count)
	{
		if (options.vulkan_semantics)
			SPIRV_CROSS_THROW("OVR_multiview2 cannot be used with Vulkan semantics.");
		if (get_execution_model() != ExecutionModelVertex)
			SPIRV_CROSS_THROW("OVR_multiview2 can only be used with Vertex shaders.");
		require_extension_internal("GL_OVR_multiview2");
	}

	// KHR one is likely to get promoted at some point, so if we don't see an explicit SPIR-V extension, assume KHR.
	for (auto &ext : ir.declared_extensions)
		if (ext == "SPV_NV_fragment_shader_barycentric")
			barycentric_is_nv = true;
}